

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

Territory __thiscall QTimeZonePrivate::territory(QTimeZonePrivate *this)

{
  bool bVar1;
  char *s;
  qsizetype sz;
  long in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<const_QLatin1String_&,_char16_t> *__range2;
  ZoneData *data;
  ZoneData *__end1;
  ZoneData *__begin1;
  ZoneData (*__range1) [361];
  QLatin1StringView token;
  sentinel __end2;
  iterator __begin2;
  QLatin1StringView sought;
  QLatin1StringView *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff26;
  undefined2 *local_a8;
  Territory local_8a;
  undefined1 local_70 [56];
  QLatin1String local_38;
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.m_data = &DAT_aaaaaaaaaaaaaaaa;
  s = QByteArray::data((QByteArray *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
  sz = QByteArray::size((QByteArray *)(in_RDI + 0x10));
  QLatin1String::QLatin1String(&local_38,s,sz);
  local_a8 = &QtTimeZoneCldr::zoneDataTable;
  do {
    if (local_a8 == (undefined2 *)&DAT_00a05816) {
      local_8a = AnyCountry;
LAB_00737d37:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_8a;
      }
      __stack_chk_fail();
    }
    QtTimeZoneCldr::ZoneData::ids
              ((ZoneData *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
    memset(local_70,0xaa,0x38);
    QStringTokenizerBase<QLatin1String,_QChar>::begin
              ((QStringTokenizerBase<QLatin1String,_QChar> *)
               CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
    QStringTokenizerBase<QLatin1String,_QChar>::end(&local_28);
    while( true ) {
      bVar1 = ::operator!=(local_70);
      if (!bVar1) break;
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*((iterator *)0x737cd4);
      bVar1 = ::operator==((QLatin1StringView *)
                           CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20),
                           in_stack_ffffffffffffff18);
      if (bVar1) {
        local_8a = local_a8[1];
        goto LAB_00737d37;
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++
                ((iterator *)CONCAT26(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20));
    }
    local_a8 = local_a8 + 3;
  } while( true );
}

Assistant:

QLocale::Territory QTimeZonePrivate::territory() const
{
    // Default fall-back mode, use the zoneTable to find Region of known Zones
    const QLatin1StringView sought(m_id.data(), m_id.size());
    for (const ZoneData &data : zoneDataTable) {
        for (QLatin1StringView token : data.ids()) {
            if (token == sought)
                return QLocale::Territory(data.territory);
        }
    }
    return QLocale::AnyTerritory;
}